

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpivotL.c
# Opt level: O0

int dpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int_t iVar4;
  flops_t *pfVar5;
  int_t *piVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  flops_t *ops;
  int_t *xlusup;
  double *lusup;
  int_t *xlsub;
  int_t *lsub;
  int_t itemp;
  int_t k;
  int_t icol;
  int_t isub;
  int_t *lsub_ptr;
  double *lu_col_ptr;
  double *lu_sup_ptr;
  double temp;
  double thresh;
  double rtemp;
  double pivmax;
  int diagind;
  int diag;
  int old_pivptr;
  int pivptr;
  int_t lptr;
  int nsupr;
  int nsupc;
  int fsupc;
  int *pivrow_local;
  int *iperm_c_local;
  int *iperm_r_local;
  int *perm_r_local;
  int *usepr_local;
  double u_local;
  int jcol_local;
  
  pfVar5 = stat->ops;
  piVar6 = Glu->lsub;
  pvVar7 = Glu->lusup;
  iVar2 = Glu->xsup[Glu->supno[jcol]];
  lsub._4_4_ = jcol - iVar2;
  iVar9 = Glu->xlsub[iVar2];
  iVar8 = Glu->xlsub[iVar2 + 1] - iVar9;
  iVar2 = Glu->xlusup[iVar2];
  iVar3 = Glu->xlusup[jcol];
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  rtemp = 0.0;
  pivmax._4_4_ = -1;
  diagind = lsub._4_4_;
  diag = lsub._4_4_;
  for (k = lsub._4_4_; k < iVar8; k = k + 1) {
    dVar10 = ABS(*(double *)((long)pvVar7 + (long)k * 8 + (long)iVar3 * 8));
    if (rtemp < dVar10) {
      diag = k;
      rtemp = dVar10;
    }
    if ((*usepr != 0) && (piVar6[(long)iVar9 + (long)k] == *pivrow)) {
      diagind = k;
    }
    if (piVar6[(long)iVar9 + (long)k] == iperm_c[jcol]) {
      pivmax._4_4_ = k;
    }
  }
  if ((rtemp != 0.0) || (NAN(rtemp))) {
    if (*usepr != 0) {
      dVar10 = ABS(*(double *)((long)pvVar7 + (long)diagind * 8 + (long)iVar3 * 8));
      if (((dVar10 == 0.0) && (!NAN(dVar10))) || (dVar10 < u * rtemp)) {
        *usepr = 0;
      }
      else {
        diag = diagind;
      }
    }
    if (*usepr == 0) {
      if (-1 < pivmax._4_4_) {
        dVar10 = ABS(*(double *)((long)pvVar7 + (long)pivmax._4_4_ * 8 + (long)iVar3 * 8));
        if (((dVar10 != 0.0) || (NAN(dVar10))) && (u * rtemp <= dVar10)) {
          diag = pivmax._4_4_;
        }
      }
      *pivrow = piVar6[(long)iVar9 + (long)diag];
    }
    perm_r[*pivrow] = jcol;
    if (diag != lsub._4_4_) {
      iVar4 = piVar6[(long)iVar9 + (long)diag];
      piVar6[(long)iVar9 + (long)diag] = piVar6[(long)iVar9 + (long)lsub._4_4_];
      piVar6[(long)iVar9 + (long)lsub._4_4_] = iVar4;
      for (itemp = 0; itemp <= lsub._4_4_; itemp = itemp + 1) {
        iVar9 = diag + itemp * iVar8;
        uVar1 = *(undefined8 *)((long)pvVar7 + (long)iVar9 * 8 + (long)iVar2 * 8);
        *(undefined8 *)((long)pvVar7 + (long)iVar9 * 8 + (long)iVar2 * 8) =
             *(undefined8 *)
              ((long)pvVar7 + (long)(lsub._4_4_ + itemp * iVar8) * 8 + (long)iVar2 * 8);
        *(undefined8 *)((long)pvVar7 + (long)(lsub._4_4_ + itemp * iVar8) * 8 + (long)iVar2 * 8) =
             uVar1;
      }
    }
    pfVar5[7] = (float)(iVar8 - lsub._4_4_) + pfVar5[7];
    dVar10 = *(double *)((long)pvVar7 + (long)lsub._4_4_ * 8 + (long)iVar3 * 8);
    while (lsub._4_4_ = lsub._4_4_ + 1, lsub._4_4_ < iVar8) {
      *(double *)((long)pvVar7 + (long)lsub._4_4_ * 8 + (long)iVar3 * 8) =
           (1.0 / dVar10) * *(double *)((long)pvVar7 + (long)lsub._4_4_ * 8 + (long)iVar3 * 8);
    }
    u_local._4_4_ = 0;
  }
  else {
    *usepr = 0;
    u_local._4_4_ = jcol + 1;
  }
  return u_local._4_4_;
}

Assistant:

int
dpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    double       pivmax, rtemp, thresh;
    double       temp;
    double       *lu_sup_ptr; 
    double       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (double *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
	rtemp = fabs (lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = fabs (lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
	    rtemp = fabs (lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += nsupr - nsupc;

    temp = 1.0 / lu_col_ptr[nsupc];
    for (k = nsupc+1; k < nsupr; k++) 
	lu_col_ptr[k] *= temp;

    return 0;
}